

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzDecompressInit(bz_stream *strm,int verbosity,int small)

{
  int iVar1;
  undefined8 *puVar2;
  DState *s;
  int small_local;
  int verbosity_local;
  bz_stream *strm_local;
  
  iVar1 = bz_config_ok();
  if (iVar1 == 0) {
    strm_local._4_4_ = -9;
  }
  else if (strm == (bz_stream *)0x0) {
    strm_local._4_4_ = -2;
  }
  else if ((small == 0) || (small == 1)) {
    if ((verbosity < 0) || (4 < verbosity)) {
      strm_local._4_4_ = -2;
    }
    else {
      if (strm->bzalloc == (_func_void_ptr_void_ptr_int_int *)0x0) {
        strm->bzalloc = default_bzalloc;
      }
      if (strm->bzfree == (_func_void_void_ptr_void_ptr *)0x0) {
        strm->bzfree = default_bzfree;
      }
      puVar2 = (undefined8 *)(*strm->bzalloc)(strm->opaque,0xfa90,1);
      if (puVar2 == (undefined8 *)0x0) {
        strm_local._4_4_ = -3;
      }
      else {
        *puVar2 = strm;
        strm->state = puVar2;
        *(undefined4 *)(puVar2 + 1) = 10;
        *(undefined4 *)((long)puVar2 + 0x24) = 0;
        *(undefined4 *)(puVar2 + 4) = 0;
        *(undefined4 *)((long)puVar2 + 0xc74) = 0;
        strm->total_in_lo32 = 0;
        strm->total_in_hi32 = 0;
        strm->total_out_lo32 = 0;
        strm->total_out_hi32 = 0;
        *(char *)((long)puVar2 + 0x2c) = (char)small;
        puVar2[0x18c] = 0;
        puVar2[0x18b] = 0;
        puVar2[0x18a] = 0;
        *(undefined4 *)(puVar2 + 6) = 0;
        *(int *)((long)puVar2 + 0x34) = verbosity;
        strm_local._4_4_ = 0;
      }
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int BZ_API(BZ2_bzDecompressInit) 
                     ( bz_stream* strm, 
                       int        verbosity,
                       int        small )
{
   DState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL) return BZ_PARAM_ERROR;
   if (small != 0 && small != 1) return BZ_PARAM_ERROR;
   if (verbosity < 0 || verbosity > 4) return BZ_PARAM_ERROR;

   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = (DState *)BZALLOC( sizeof(DState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm                  = strm;
   strm->state              = s;
   s->state                 = BZ_X_MAGIC_1;
   s->bsLive                = 0;
   s->bsBuff                = 0;
   s->calculatedCombinedCRC = 0;
   strm->total_in_lo32      = 0;
   strm->total_in_hi32      = 0;
   strm->total_out_lo32     = 0;
   strm->total_out_hi32     = 0;
   s->smallDecompress       = (Bool)small;
   s->ll4                   = NULL;
   s->ll16                  = NULL;
   s->tt                    = NULL;
   s->currBlockNo           = 0;
   s->verbosity             = verbosity;

   return BZ_OK;
}